

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this)

{
  slot_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  ulong *puVar4;
  ulong uVar5;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  size_type sVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  size_type sVar11;
  ctrl_t *pcVar12;
  unsigned_long uVar13;
  size_t i;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  size_t i_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  FindInfo FVar19;
  type raw;
  ulong *local_60;
  ulong local_50;
  ulong uStack_48;
  int local_40;
  _Any_data *local_38;
  
  uVar5 = this->capacity_;
  if ((uVar5 == 0) || ((uVar5 + 1 & uVar5) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                  ,0x749,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, std::function<unsigned long (const std::basic_string<char> &)>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = std::function<unsigned long (const std::basic_string<char> &)>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, int>>]"
                 );
  }
  if (uVar5 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                  ,0x74a,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, std::function<unsigned long (const std::basic_string<char> &)>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = std::function<unsigned long (const std::basic_string<char> &)>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, int>>]"
                 );
  }
  pcVar6 = this->ctrl_;
  if (pcVar6[uVar5] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                  ,0x1be,
                  "void phmap::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar12 = pcVar6 + uVar5;
  if (pcVar12 + 1 != pcVar6) {
    auVar17[8] = 0x7e;
    auVar17._0_8_ = 0x7e7e7e7e7e7e7e7e;
    auVar17[9] = 0x7e;
    auVar17[10] = 0x7e;
    auVar17[0xb] = 0x7e;
    auVar17[0xc] = 0x7e;
    auVar17[0xd] = 0x7e;
    auVar17[0xe] = 0x7e;
    auVar17[0xf] = 0x7e;
    auVar18._8_8_ = 0x8080808080808080;
    auVar18._0_8_ = 0x8080808080808080;
    uVar15 = 0;
    do {
      auVar9 = vpshufb_avx(auVar17,*(undefined1 (*) [16])(pcVar6 + uVar15));
      auVar9 = vpor_avx(auVar9,auVar18);
      *(undefined1 (*) [16])(pcVar6 + uVar15) = auVar9;
      uVar15 = uVar15 + 0x10;
    } while (uVar5 + 1 != uVar15);
  }
  uVar10 = *(undefined8 *)(pcVar6 + 8);
  *(undefined8 *)(pcVar12 + 1) = *(undefined8 *)pcVar6;
  *(undefined8 *)(pcVar12 + 9) = uVar10;
  *pcVar12 = -1;
  if (this->capacity_ != 0) {
    local_38 = (_Any_data *)
               &(this->settings_).
                super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                .
                super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
    ;
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        if ((this->settings_).
            super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
            .value.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        uVar13 = (*(this->settings_).
                   super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                   .
                   super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                   .value._M_invoker)
                           (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(this->slots_ + i_00));
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar13;
        uVar15 = SUB168(auVar9 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar9 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar19 = find_first_non_full(this,uVar15);
        i = FVar19.offset;
        uVar5 = this->capacity_;
        if ((uVar5 + 1 & uVar5) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                        ,0x44,
                        "phmap::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar14 = uVar15 >> 7 & uVar5;
        bVar16 = (byte)uVar15;
        if (((i_00 - uVar14 ^ i - uVar14) & uVar5) < 0x10) {
          bVar16 = bVar16 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar16 & 0x7f);
            puVar4 = (ulong *)((long)this->slots_ + i_00 * 0x28 + 0x10);
            if ((ulong *)puVar4[-2] == puVar4) {
              local_50 = *puVar4;
              uStack_48 = puVar4[1];
              local_60 = &local_50;
            }
            else {
              local_50 = *puVar4;
              local_60 = (ulong *)puVar4[-2];
            }
            psVar1 = this->slots_ + i_00;
            sVar8 = (psVar1->value).first._M_string_length;
            *(ulong **)psVar1 = puVar4;
            (psVar1->key)._M_string_length = 0;
            (psVar1->value).first.field_2._M_local_buf[0] = '\0';
            local_40 = (psVar1->value).second;
            psVar7 = this->slots_;
            psVar2 = (size_type *)((long)psVar7 + i_00 * 0x28 + 0x10);
            psVar3 = (size_type *)((long)psVar7 + i * 0x28 + 0x10);
            psVar1 = psVar7 + i_00;
            psVar2[-2] = (size_type)psVar2;
            if ((size_type *)psVar3[-2] == psVar3) {
              sVar11 = psVar3[1];
              *psVar2 = *psVar3;
              psVar2[1] = sVar11;
            }
            else {
              (psVar1->value).first._M_dataplus._M_p = (pointer)psVar3[-2];
              (psVar1->value).first.field_2._M_allocated_capacity = *psVar3;
            }
            psVar7 = psVar7 + i;
            (psVar1->value).first._M_string_length = (psVar7->value).first._M_string_length;
            *(size_type **)psVar7 = psVar3;
            (psVar7->key)._M_string_length = 0;
            (psVar7->value).first.field_2._M_local_buf[0] = '\0';
            (psVar1->value).second = (psVar7->value).second;
            psVar1 = this->slots_ + i;
            puVar4 = (ulong *)((long)this->slots_ + i * 0x28 + 0x10);
            puVar4[-2] = (ulong)puVar4;
            if (local_60 == &local_50) {
              *puVar4 = local_50;
              puVar4[1] = uStack_48;
            }
            else {
              (psVar1->value).first._M_dataplus._M_p = (pointer)local_60;
              (psVar1->value).first.field_2._M_allocated_capacity = local_50;
            }
            i_00 = i_00 - 1;
            (psVar1->value).first._M_string_length = sVar8;
            local_50 = local_50 & 0xffffffffffffff00;
            (psVar1->value).second = local_40;
            goto LAB_00169a6b;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                          ,0x77a,
                          "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, std::function<unsigned long (const std::basic_string<char> &)>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = std::function<unsigned long (const std::basic_string<char> &)>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, int>>]"
                         );
          }
          set_ctrl(this,i,bVar16 & 0x7f);
          psVar7 = this->slots_;
          psVar2 = (size_type *)((long)psVar7 + i * 0x28 + 0x10);
          psVar1 = psVar7 + i;
          psVar3 = (size_type *)((long)psVar7 + i_00 * 0x28 + 0x10);
          psVar2[-2] = (size_type)psVar2;
          if ((size_type *)psVar3[-2] == psVar3) {
            sVar8 = psVar3[1];
            *psVar2 = *psVar3;
            psVar2[1] = sVar8;
          }
          else {
            (psVar1->value).first._M_dataplus._M_p = (pointer)psVar3[-2];
            (psVar1->value).first.field_2._M_allocated_capacity = *psVar3;
          }
          psVar7 = psVar7 + i_00;
          (psVar1->value).first._M_string_length = (psVar7->value).first._M_string_length;
          *(size_type **)psVar7 = psVar3;
          (psVar7->key)._M_string_length = 0;
          (psVar7->value).first.field_2._M_local_buf[0] = '\0';
          bVar16 = 0x80;
          (psVar1->value).second = (psVar7->value).second;
        }
        set_ctrl(this,i_00,bVar16);
      }
LAB_00169a6b:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename std::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hash = PolicyTraits::apply(HashElement{hash_ref()},
                                              PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hash);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hash.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hash).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hash));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hash));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hash));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left();
    }